

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSetColumnEnabled(int column_n,bool enabled)

{
  ImGuiTable *pIVar1;
  ImGuiTableColumn *pIVar2;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x60e,"void ImGui::TableSetColumnEnabled(int, bool)");
  }
  if ((pIVar1->Flags & 4) != 0) {
    if (((-1 < column_n) || (column_n = pIVar1->CurrentColumn, -1 < column_n)) &&
       (column_n < pIVar1->ColumnsCount)) {
      pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,column_n);
      pIVar2->IsUserEnabledNextFrame = enabled;
      return;
    }
    __assert_fail("column_n >= 0 && column_n < table->ColumnsCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x614,"void ImGui::TableSetColumnEnabled(int, bool)");
  }
  __assert_fail("table->Flags & ImGuiTableFlags_Hideable",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                ,0x611,"void ImGui::TableSetColumnEnabled(int, bool)");
}

Assistant:

void ImGui::TableSetColumnEnabled(int column_n, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL);
    if (!table)
        return;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Hideable); // See comments above
    if (column_n < 0)
        column_n = table->CurrentColumn;
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column = &table->Columns[column_n];
    column->IsUserEnabledNextFrame = enabled;
}